

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

uint32_t helper_vfp_fcvt_f32_to_f16_arm(float32 a,void *fpstp,uint32_t ahp_mode)

{
  flag val;
  float16 fVar1;
  float16 r;
  flag save;
  float_status *fpst;
  uint32_t ahp_mode_local;
  void *fpstp_local;
  float32 a_local;
  
  val = get_flush_to_zero((float_status *)fpstp);
  set_flush_to_zero('\0',(float_status *)fpstp);
  fVar1 = float32_to_float16_arm(a,(_Bool)((ahp_mode != 0 ^ 0xffU) & 1),(float_status *)fpstp);
  set_flush_to_zero(val,(float_status *)fpstp);
  return (uint32_t)fVar1;
}

Assistant:

uint32_t HELPER(vfp_fcvt_f32_to_f16)(float32 a, void *fpstp, uint32_t ahp_mode)
{
    /* Squash FZ16 to 0 for the duration of conversion.  In this case,
     * it would affect flushing output denormals.
     */
    float_status *fpst = fpstp;
    flag save = get_flush_to_zero(fpst);
    set_flush_to_zero(false, fpst);
    float16 r = float32_to_float16(a, !ahp_mode, fpst);
    set_flush_to_zero(save, fpst);
    return r;
}